

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::addInput
          (Result *__return_storage_ptr__,OneHotEncoder *this,string *inputName,
          FeatureType *inputType)

{
  initializer_list<CoreML::FeatureType> __l;
  FeatureType *featureName;
  bool bVar1;
  FeatureType *local_f0;
  FeatureType local_b8;
  byte local_a5;
  uint local_a4;
  FeatureType local_a0;
  allocator<CoreML::FeatureType> local_8d [13];
  undefined1 *local_80;
  undefined1 local_78 [32];
  FeatureType local_58;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> local_48;
  byte local_29;
  FeatureType *local_28;
  FeatureType *inputType_local;
  string *inputName_local;
  OneHotEncoder *this_local;
  Result *_result;
  
  local_29 = 0;
  local_80 = local_78;
  local_28 = inputType;
  inputType_local = (FeatureType *)inputName;
  inputName_local = (string *)this;
  this_local = (OneHotEncoder *)__return_storage_ptr__;
  FeatureType::Int64();
  local_80 = local_78 + 0x10;
  FeatureType::String();
  local_58.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_78;
  local_58.m_type.super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  std::allocator<CoreML::FeatureType>::allocator(local_8d);
  __l._M_len = (size_type)
               local_58.m_type.
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_58.m_type.
                 super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::vector
            (&local_48,__l,local_8d);
  FeatureType::FeatureType(&local_a0,inputType);
  Model::enforceTypeInvariant(__return_storage_ptr__,&local_48,&local_a0);
  FeatureType::~FeatureType(&local_a0);
  std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::~vector(&local_48);
  std::allocator<CoreML::FeatureType>::~allocator(local_8d);
  local_f0 = &local_58;
  do {
    local_f0 = local_f0 + -1;
    FeatureType::~FeatureType(local_f0);
  } while (local_f0 != (FeatureType *)local_78);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_29 = 1;
  }
  local_a4 = (uint)!bVar1;
  if ((local_29 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  featureName = inputType_local;
  if (local_a4 == 0) {
    local_a5 = 0;
    FeatureType::FeatureType(&local_b8,inputType);
    Model::addInput(__return_storage_ptr__,&this->super_Model,(string *)featureName,&local_b8);
    FeatureType::~FeatureType(&local_b8);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_a5 = 1;
    }
    local_a4 = (uint)!bVar1;
    if ((local_a5 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_a4 == 0) {
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::addInput(const std::string& inputName, FeatureType inputType) {
        
        HANDLE_RESULT_AND_RETURN_ON_ERROR(enforceTypeInvariant({
            FeatureType::Int64(),
            FeatureType::String(),
        }, inputType));
        
        HANDLE_RESULT_AND_RETURN_ON_ERROR(Model::addInput(inputName, inputType));
        return Result();
    }